

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall runtime::VirtualMachine::Subtract(VirtualMachine *this)

{
  element_type *peVar1;
  VariableType VVar2;
  anon_union_8_6_52c89740_for_Variable_1 aVar3;
  undefined8 uVar4;
  Variable VVar5;
  Variable VVar6;
  
  VVar5 = popOpStack(this);
  VVar2 = VVar5.type;
  VVar6 = popOpStack(this);
  if (VVar6.type == VVar2) {
    if (VVar2 == Float) {
      aVar3.doubleValue = VVar6.field_1.doubleValue - VVar5.field_1.doubleValue;
      uVar4 = 3;
      goto LAB_00116285;
    }
    if (VVar2 == Integer) {
      aVar3.integerValue = VVar6.field_1.integerValue - VVar5.field_1.integerValue;
      uVar4 = 1;
      goto LAB_00116285;
    }
  }
  uVar4 = 0;
  aVar3.integerValue = 0;
LAB_00116285:
  VVar5.field_1.integerValue = aVar3.integerValue;
  VVar5._0_8_ = uVar4;
  pushOpStack(this,VVar5);
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::Subtract() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  if (!this->protectDifferentTypes(first, second)) {
    this->advance();
    return;
  }

  if (first.type == VariableType::Integer) {
    this->pushInteger(first.integerValue - second.integerValue);

  } else if (first.type == VariableType::Float) {
    this->pushFloat(first.doubleValue - second.doubleValue);

  } else {
    this->pushUndefined();
  }

  this->advance();
}